

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_passLinearObjectives
                   (void *highs,HighsInt num_linear_objective,double *weight,double *offset,
                   double *coefficients,double *abs_tolerance,double *rel_tolerance,
                   HighsInt *priority)

{
  HighsInt HVar1;
  int in_ESI;
  HighsInt iCol;
  HighsInt num_col;
  HighsInt iObj;
  HighsLinearObjective linear_objective;
  HighsInt status;
  HighsStatus in_stack_ffffffffffffff5c;
  HighsInt HVar2;
  undefined4 in_stack_ffffffffffffff64;
  int iVar3;
  undefined4 in_stack_ffffffffffffff6c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  undefined4 local_84;
  undefined4 local_4;
  
  local_4 = Highs_clearLinearObjectives((void *)0x43710d);
  if (local_4 == kOk) {
    HighsLinearObjective::HighsLinearObjective((HighsLinearObjective *)0x437132);
    for (local_84 = 0; local_84 < in_ESI; local_84 = local_84 + 1) {
      HVar1 = Highs_getNumCol((void *)0x437158);
      HVar2 = HVar1;
      for (iVar3 = 0; iVar3 < HVar1; iVar3 = iVar3 + 1) {
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_ffffffffffffff70,
                   (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff6c,iVar3));
      }
      in_stack_ffffffffffffff5c =
           Highs::addLinearObjective
                     ((Highs *)CONCAT44(in_stack_ffffffffffffff6c,iVar3),
                      (HighsLinearObjective *)CONCAT44(in_stack_ffffffffffffff64,HVar2),
                      in_stack_ffffffffffffff5c);
      local_4 = in_stack_ffffffffffffff5c;
      if (in_stack_ffffffffffffff5c != kOk) goto LAB_004372c7;
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)0x4372a4);
    }
    local_4 = kOk;
LAB_004372c7:
    HighsLinearObjective::~HighsLinearObjective((HighsLinearObjective *)0x4372d1);
  }
  return local_4;
}

Assistant:

HighsInt Highs_passLinearObjectives(const void* highs,
                                    const HighsInt num_linear_objective,
                                    const double* weight, const double* offset,
                                    const double* coefficients,
                                    const double* abs_tolerance,
                                    const double* rel_tolerance,
                                    const HighsInt* priority) {
  HighsInt status = Highs_clearLinearObjectives(highs);
  if (status != kHighsStatusOk) return status;
  HighsLinearObjective linear_objective;
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsInt num_col = Highs_getNumCol(highs);
    linear_objective.weight = weight[iObj];
    linear_objective.offset = offset[iObj];
    for (HighsInt iCol = 0; iCol < num_col; iCol++)
      linear_objective.coefficients.push_back(
          coefficients[iObj * num_col + iCol]);
    linear_objective.abs_tolerance = abs_tolerance[iObj];
    linear_objective.rel_tolerance = rel_tolerance[iObj];
    linear_objective.priority = priority[iObj];
    linear_objective.weight = weight[iObj];
    status =
        HighsInt(((Highs*)highs)->addLinearObjective(linear_objective, iObj));
    if (status != kHighsStatusOk) return status;
    linear_objective.coefficients.clear();
  }
  return kHighsStatusOk;
}